

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int test_unsigned<unsigned_short>(char *Name)

{
  unsigned_short uVar1;
  ostream *poVar2;
  unsigned_short local_20;
  unsigned_short local_1e;
  undefined2 local_1c;
  unsigned_short local_1a;
  unsigned_short tmp2;
  uint8_t tmp [2];
  uint8_t cst_4_be [2];
  uint8_t cst_4_le [2];
  char *Name_local;
  
  _tmp2 = Name;
  memset(&local_1a,0,2);
  memset(&local_1c,0,2);
  local_1a = CONCAT11(local_1a._1_1_,4);
  local_1c = CONCAT11(4,(uint8_t)local_1c);
  uVar1 = intmem::loadu_le<unsigned_short>((uint8_t *)&local_1a);
  if (uVar1 == 4) {
    uVar1 = intmem::loadu_be<unsigned_short>((uint8_t *)&local_1c);
    if (uVar1 == 4) {
      uVar1 = intmem::load_le<unsigned_short>(&local_1a);
      if (uVar1 == 4) {
        uVar1 = intmem::load_be<unsigned_short>(&local_1c);
        if (uVar1 == 4) {
          intmem::storeu_le<unsigned_short>(&local_1e,4);
          if (local_1e == local_1a) {
            intmem::storeu_be<unsigned_short>(&local_1e,4);
            if (local_1e == local_1c) {
              intmem::store_le<unsigned_short>(&local_20,4);
              if (local_20 == local_1a) {
                intmem::storeu_be<unsigned_short>(&local_20,4);
                if (local_20 == local_1c) {
                  Name_local._4_4_ = 0;
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
                  poVar2 = std::operator<<(poVar2,": error storing BE integer!");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  Name_local._4_4_ = 1;
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
                poVar2 = std::operator<<(poVar2,": error storing LE integer!");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                Name_local._4_4_ = 1;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
              poVar2 = std::operator<<(poVar2,": error storing BE integer!");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              Name_local._4_4_ = 1;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
            poVar2 = std::operator<<(poVar2,": error storing LE integer!");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            Name_local._4_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
          poVar2 = std::operator<<(poVar2,": error loading BE integer!");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          Name_local._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
        poVar2 = std::operator<<(poVar2,": error loading LE integer!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Name_local._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
      poVar2 = std::operator<<(poVar2,": error loading BE integer!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Name_local._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
    poVar2 = std::operator<<(poVar2,": error loading LE integer!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Name_local._4_4_ = 1;
  }
  return Name_local._4_4_;
}

Assistant:

int test_unsigned(const char* Name)
{
  ALIGN(alignof(T)) uint8_t cst_4_le[sizeof(T)] = {0};
  ALIGN(alignof(T)) uint8_t cst_4_be[sizeof(T)] = {0};
  cst_4_le[0] = 4;
  cst_4_be[sizeof(T)-1] = 4;
  if (loadu_le<T>(cst_4_le) != 4) {
    std::cerr << Name << ": error loading LE integer!" << std::endl;
    return 1;
  }
  if (loadu_be<T>(cst_4_be) != 4) {
    std::cerr << Name << ": error loading BE integer!" << std::endl;
    return 1;
  }
  if (load_le<T>((T*) cst_4_le) != 4) {
    std::cerr << Name << ": error loading LE integer!" << std::endl;
    return 1;
  }
  if (load_be<T>((T*) cst_4_be) != 4) {
    std::cerr << Name << ": error loading BE integer!" << std::endl;
    return 1;
  }

  ALIGN(alignof(T)) uint8_t tmp[sizeof(T)];
  storeu_le<T>(tmp, 4);
  if (memcmp(tmp, cst_4_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(tmp, 4);
  if (memcmp(tmp, cst_4_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }

  T tmp2;
  store_le<T>(&tmp2, 4);
  if (memcmp(&tmp2, cst_4_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(&tmp2, 4);
  if (memcmp(&tmp2, cst_4_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }
  return 0;
}